

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O2

uint64_t duckdb_get_enum_value(duckdb_value value)

{
  uint64_t uVar1;
  Value val;
  Value local_48;
  
  if (value == (duckdb_value)0x0) {
    uVar1 = 0;
  }
  else {
    duckdb::Value::Value(&local_48,(Value *)value);
    if ((local_48.type_.id_ == ENUM) && (local_48.is_null == false)) {
      uVar1 = duckdb::Value::GetValue<unsigned_long>(&local_48);
    }
    else {
      uVar1 = 0;
    }
    duckdb::Value::~Value(&local_48);
  }
  return uVar1;
}

Assistant:

uint64_t duckdb_get_enum_value(duckdb_value value) {
	if (!value) {
		return 0;
	}

	auto val = UnwrapValue(value);
	if (val.type().id() != LogicalTypeId::ENUM || val.IsNull()) {
		return 0;
	}

	return val.GetValue<uint64_t>();
}